

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithm.h
# Opt level: O2

void idx2::InsertionSort<idx2::sub_channel_info*>(sub_channel_info *Beg,sub_channel_info *End)

{
  sub_channel *psVar1;
  sub_channel *psVar2;
  i8 iVar3;
  undefined6 uVar4;
  i8 iVar5;
  i8 iVar6;
  undefined6 uVar7;
  sub_channel_info *psVar8;
  sub_channel_info *psVar9;
  sub_channel_info *End_00;
  
  End_00 = Beg;
  if (Beg != End) {
    while (End_00 = End_00 + 1, End_00 != End) {
      psVar8 = BinarySearch<idx2::sub_channel_info,idx2::sub_channel_info*>(Beg,End_00,End_00);
      for (psVar9 = End_00; psVar9 != psVar8; psVar9 = psVar9 + -1) {
        iVar5 = psVar9->Level;
        iVar6 = psVar9->Subband;
        uVar7 = *(undefined6 *)&psVar9->field_0x2;
        psVar1 = psVar9->SubChannel;
        iVar3 = psVar9[-1].Subband;
        uVar4 = *(undefined6 *)&psVar9[-1].field_0x2;
        psVar2 = psVar9[-1].SubChannel;
        psVar9->Level = psVar9[-1].Level;
        psVar9->Subband = iVar3;
        *(undefined6 *)&psVar9->field_0x2 = uVar4;
        psVar9->SubChannel = psVar2;
        psVar9[-1].Level = iVar5;
        psVar9[-1].Subband = iVar6;
        *(undefined6 *)&psVar9[-1].field_0x2 = uVar7;
        psVar9[-1].SubChannel = psVar1;
      }
    }
  }
  return;
}

Assistant:

void
InsertionSort(i Beg, i End)
{
  if (Beg == End)
    return;
  i Last = Beg + 1;
  while (Last != End)
  {
    i Pos = BinarySearch(Beg, Last, *Last);
    for (i It = Last; It != Pos; --It)
      Swap(It, It - 1);
    ++Last;
  }
}